

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

int __thiscall btConvexHullInternal::Rational64::compare(Rational64 *this,Rational64 *b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Int128 IVar4;
  Int128 IVar5;
  
  iVar1 = this->sign;
  iVar2 = iVar1 - b->sign;
  if (iVar2 == 0) {
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      IVar4 = Int128::mul(this->m_numerator,b->m_denominator);
      IVar5 = Int128::mul(this->m_denominator,b->m_numerator);
      uVar3 = 0xffffffff;
      if (IVar5.high <= IVar4.high) {
        if (IVar5.high < IVar4.high) {
          uVar3 = 1;
        }
        else if (IVar5.low <= IVar4.low) {
          uVar3 = (uint)(IVar5.low < IVar4.low);
        }
      }
      iVar2 = uVar3 * iVar1;
    }
  }
  return iVar2;
}

Assistant:

int btConvexHullInternal::Rational64::compare(const Rational64& b) const
{
	if (sign != b.sign)
	{
		return sign - b.sign;
	}
	else if (sign == 0)
	{
		return 0;
	}

	//	return (numerator * b.denominator > b.numerator * denominator) ? sign : (numerator * b.denominator < b.numerator * denominator) ? -sign : 0;

#ifdef USE_X86_64_ASM

	int result;
	int64_t tmp;
	int64_t dummy;
	__asm__ ("mulq %[bn]\n\t"
					 "movq %%rax, %[tmp]\n\t"
					 "movq %%rdx, %%rbx\n\t"
					 "movq %[tn], %%rax\n\t"
					 "mulq %[bd]\n\t"
					 "subq %[tmp], %%rax\n\t"
					 "sbbq %%rbx, %%rdx\n\t" // rdx:rax contains 128-bit-difference "numerator*b.denominator - b.numerator*denominator"
					 "setnsb %%bh\n\t" // bh=1 if difference is non-negative, bh=0 otherwise
					 "orq %%rdx, %%rax\n\t"
					 "setnzb %%bl\n\t" // bl=1 if difference if non-zero, bl=0 if it is zero
					 "decb %%bh\n\t" // now bx=0x0000 if difference is zero, 0xff01 if it is negative, 0x0001 if it is positive (i.e., same sign as difference)
					 "shll $16, %%ebx\n\t" // ebx has same sign as difference
					 : "=&b"(result), [tmp] "=&r"(tmp), "=a"(dummy)
					 : "a"(denominator), [bn] "g"(b.numerator), [tn] "g"(numerator), [bd] "g"(b.denominator)
					 : "%rdx", "cc" );
	return result ? result ^ sign // if sign is +1, only bit 0 of result is inverted, which does not change the sign of result (and cannot result in zero)
																// if sign is -1, all bits of result are inverted, which changes the sign of result (and again cannot result in zero)
								: 0;

#else

	return sign * Int128::mul(m_numerator, b.m_denominator).ucmp(Int128::mul(m_denominator, b.m_numerator));

#endif
}